

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall Log_Cerr_Buffer::sync(Log_Cerr_Buffer *this)

{
  char *__s;
  long lVar1;
  ulong uVar2;
  string buffer;
  char *local_78;
  ulong local_70;
  char local_68 [16];
  string *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  if ((anonymous_namespace)::private_instance == 0) {
    Nova::Log::Initialize_Logging(false,false,0x40000000,false);
  }
  if (*(char *)((anonymous_namespace)::private_instance + 0xd) == '\0') {
    if (Nova::Log::Log_Entry::start_on_separate_line == true) {
      putchar(10);
    }
    Nova::Log::Log_Entry::start_on_separate_line = false;
    std::__cxx11::stringbuf::str();
    fputs(local_78,_stderr);
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    if ((anonymous_namespace)::private_instance == 0) {
      Nova::Log::Initialize_Logging(false,false,0x40000000,false);
    }
  }
  if (*(FILE **)((anonymous_namespace)::private_instance + 0x10) != (FILE *)0x0) {
    if (Nova::Log::Log_Entry::log_file_start_on_separate_line == true) {
      putc(10,*(FILE **)((anonymous_namespace)::private_instance + 0x10));
    }
    Nova::Log::Log_Entry::log_file_start_on_separate_line = false;
    local_58 = (string *)this;
    std::__cxx11::stringbuf::str();
    uVar2 = 0;
    do {
      if (local_70 <= uVar2) break;
      lVar1 = std::__cxx11::string::find((char)&local_78,10);
      if ((anonymous_namespace)::private_instance == 0) {
        Nova::Log::Initialize_Logging(false,false,0x40000000,false);
      }
      if (*(char *)((anonymous_namespace)::private_instance + 0x1d) == '\x01') {
        fputs("<error><!--",*(FILE **)((anonymous_namespace)::private_instance + 0x10));
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_78);
      __s = local_50[0];
      if ((anonymous_namespace)::private_instance == 0) {
        Nova::Log::Initialize_Logging(false,false,0x40000000,false);
      }
      fputs(__s,*(FILE **)((anonymous_namespace)::private_instance + 0x10));
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((anonymous_namespace)::private_instance == 0) {
        Nova::Log::Initialize_Logging(false,false,0x40000000,false);
      }
      if ((*(char *)((anonymous_namespace)::private_instance + 0x1d) != '\0') &&
         (fputs("--></error>",*(FILE **)((anonymous_namespace)::private_instance + 0x10)),
         (anonymous_namespace)::private_instance == 0)) {
        Nova::Log::Initialize_Logging(false,false,0x40000000,false);
      }
      putc(10,*(FILE **)((anonymous_namespace)::private_instance + 0x10));
      uVar2 = lVar1 + 1;
    } while (uVar2 != 0);
    this = (Log_Cerr_Buffer *)local_58;
    if (local_78 != local_68) {
      operator_delete(local_78);
      this = (Log_Cerr_Buffer *)local_58;
    }
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  std::__cxx11::stringbuf::str((string *)this);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

int sync()
    {
        if(!Instance()->suppress_cerr){
            if(Log_Entry::start_on_separate_line) putchar('\n');Log_Entry::start_on_separate_line=false;
            fputs(str().c_str(),stderr);}
        if(Instance()->log_file){
            if(Log_Entry::log_file_start_on_separate_line) putc('\n',Instance()->log_file);Log_Entry::log_file_start_on_separate_line=false;
            std::string buffer=str();
            for(size_t start=0;start<buffer.length();){
                size_t end=buffer.find('\n',start);
                if(Instance()->xml) fputs("<error><!--",Instance()->log_file);
                fputs(buffer.substr(start,end-start).c_str(),Instance()->log_file);
                if(Instance()->xml) fputs("--></error>",Instance()->log_file);
                putc('\n',Instance()->log_file);
                if(end!=std::string::npos) start=end+1;
                else break;}}
        str("");return std::stringbuf::sync();
    }